

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.2.13.10.hpp
# Opt level: O0

string * __thiscall
Catch::Matchers::StdString::CasedString::adjustString(CasedString *this,string *str)

{
  string *in_RDX;
  int *in_RSI;
  string *in_RDI;
  
  if (*in_RSI == 1) {
    toLower(in_RDI);
  }
  else {
    std::__cxx11::string::string((string *)in_RDI,in_RDX);
  }
  return in_RDI;
}

Assistant:

std::string CasedString::adjustString( std::string const& str ) const {
            return m_caseSensitivity == CaseSensitive::No
                   ? toLower( str )
                   : str;
        }